

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool absl::lts_20250127::(anonymous_namespace)::Base64UnescapeInternal<std::__cxx11::string>
               (Nullable<const_char_*> src,size_t slen,
               Nonnull<std::__cxx11::basic_string<char>_*> dest,array<signed_char,_256UL> *unbase64)

{
  Nonnull<std::__cxx11::basic_string<char>_*> szsrc;
  size_t src_param;
  bool bVar1;
  Nullable<char_*> dest_00;
  ulong uStack_40;
  bool ok;
  size_t len;
  size_t dest_len;
  array<signed_char,_256UL> *unbase64_local;
  Nonnull<std::__cxx11::basic_string<char>_*> dest_local;
  size_t slen_local;
  Nullable<const_char_*> src_local;
  
  len = (slen >> 2) * 3 + (slen & 3);
  dest_len = (size_t)unbase64;
  unbase64_local = (array<signed_char,_256UL> *)dest;
  dest_local = (Nonnull<std::__cxx11::basic_string<char>_*>)slen;
  slen_local = (size_t)src;
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>(dest,len);
  src_param = slen_local;
  szsrc = dest_local;
  dest_00 = (Nullable<char_*>)std::__cxx11::string::operator[]((ulong)unbase64_local);
  bVar1 = anon_unknown_0::Base64UnescapeInternal
                    ((Nullable<const_char_*>)src_param,(size_t)szsrc,dest_00,len,
                     (array<signed_char,_256UL> *)dest_len,&stack0xffffffffffffffc0);
  if (bVar1) {
    if (len < uStack_40) {
      __assert_fail("len <= dest_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/escaping.cc"
                    ,0x349,
                    "bool absl::lts_20250127::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nonnull<String *>, const std::array<signed char, 256> &) [String = std::basic_string<char>]"
                   );
    }
    std::__cxx11::string::erase((ulong)unbase64_local,uStack_40);
    src_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::clear();
    src_local._7_1_ = false;
  }
  return src_local._7_1_;
}

Assistant:

bool Base64UnescapeInternal(absl::Nullable<const char*> src, size_t slen,
                            absl::Nonnull<String*> dest,
                            const std::array<signed char, 256>& unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  Any leftover chars are added directly for good measure.
  const size_t dest_len = 3 * (slen / 4) + (slen % 4);

  strings_internal::STLStringResizeUninitialized(dest, dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  size_t len;
  const bool ok =
      Base64UnescapeInternal(src, slen, &(*dest)[0], dest_len, unbase64, &len);
  if (!ok) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  assert(len <= dest_len);
  dest->erase(len);

  return true;
}